

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O1

void __thiscall ConditionalEstimator::collect(ConditionalEstimator *this)

{
  uint *puVar1;
  Ring<double> *this_00;
  Ring<bool> *this_01;
  bool bVar2;
  int iVar3;
  uint uVar4;
  bool *pbVar5;
  double *pdVar6;
  long lVar7;
  double d;
  double dVar8;
  int local_34;
  double local_30;
  
  (*(((this->super_Estimator).pSource)->super_Parametric)._vptr_Parametric
    [(ulong)(((this->super_Estimator).nEstimate & 0x40) == 0) + 7])();
  this_00 = &this->condSampleRing;
  local_30 = d;
  Ring<double>::next(this_00,d);
  if (this->condTrigger == (StochasticEventGenerator *)0x0) {
    Ring<double>::next(&this->condConditionRing,local_30);
    if ((this->condSampleRing).ringIsInitialised == true) {
      local_34 = this->nPre + -1;
      pdVar6 = Ring<double>::operator[](&this->condConditionRing,&local_34);
      local_30 = *pdVar6;
      puVar1 = &(this->super_Estimator).nSamples;
      *puVar1 = *puVar1 + 1;
      if ((((this->super_Estimator).nEstimate & 1) != 0) && (-1 < this->nPost + this->nPre)) {
        lVar7 = -1;
        do {
          local_34 = (int)lVar7 + 2;
          pdVar6 = Ring<double>::operator[](this_00,&local_34);
          this->condSamples[lVar7 + 1] = *pdVar6 * local_30;
          lVar7 = lVar7 + 1;
        } while (lVar7 < (long)this->nPost + (long)this->nPre);
      }
      if ((((this->super_Estimator).nEstimate & 4) != 0) && (-1 < this->nPost + this->nPre)) {
        lVar7 = -1;
        do {
          local_34 = (int)lVar7 + 2;
          pdVar6 = Ring<double>::operator[](this_00,&local_34);
          this->aOne[lVar7 + 1] = *pdVar6 * local_30 + this->aOne[lVar7 + 1];
          lVar7 = lVar7 + 1;
        } while (lVar7 < (long)this->nPost + (long)this->nPre);
      }
      if ((((this->super_Estimator).nEstimate & 8) != 0) && (-1 < this->nPost + this->nPre)) {
        lVar7 = -1;
        do {
          local_34 = (int)lVar7 + 2;
          pdVar6 = Ring<double>::operator[](this_00,&local_34);
          this->aTwo[lVar7 + 1] = *pdVar6 * *pdVar6 * local_30 + this->aTwo[lVar7 + 1];
          lVar7 = lVar7 + 1;
        } while (lVar7 < (long)this->nPost + (long)this->nPre);
      }
      if ((((this->super_Estimator).nEstimate & 0x10) != 0) && (-1 < this->nPost + this->nPre)) {
        lVar7 = -1;
        do {
          local_34 = (int)lVar7 + 2;
          pdVar6 = Ring<double>::operator[](this_00,&local_34);
          dVar8 = *pdVar6;
          this->aThree[lVar7 + 1] = dVar8 * dVar8 * dVar8 * local_30 + this->aThree[lVar7 + 1];
          lVar7 = lVar7 + 1;
        } while (lVar7 < (long)this->nPost + (long)this->nPre);
      }
      if ((((this->super_Estimator).nEstimate & 2) != 0) &&
         (local_34 = 0, -1 < this->nPost + this->nPre)) {
        do {
          pdVar6 = Ring<double>::operator[](this_00,&local_34);
          dVar8 = floor((*pdVar6 * local_30 - this->dDistOffset) / this->dDistScale + 0.5);
          uVar4 = (uint)dVar8;
          if (-1 < (int)uVar4 && (int)uVar4 <= this->nDist) {
            this->aDist[local_34][uVar4] = this->aDist[local_34][uVar4] + 1.0;
          }
          bVar2 = local_34 < this->nPost + this->nPre;
          local_34 = local_34 + 1;
        } while (bVar2);
      }
    }
  }
  else {
    this_01 = &this->condEventRing;
    iVar3 = (*(this->condTrigger->super_StochasticVariable).super_StochasticProcess.super_Parametric
              ._vptr_Parametric[0xf])();
    Ring<bool>::next(this_01,SUB41(iVar3,0));
    if ((this->condSampleRing).ringIsInitialised == true) {
      local_34 = this->nPre + this->nUpdateCorrection + 1;
      pbVar5 = Ring<bool>::operator[](this_01,&local_34);
      if ((*pbVar5 == true) && (bVar2 = hasAdditionalEvents(this), !bVar2)) {
        puVar1 = &(this->super_Estimator).nSamples;
        *puVar1 = *puVar1 + 1;
        if ((((this->super_Estimator).nEstimate & 1) != 0) && (-1 < this->nPost + this->nPre)) {
          lVar7 = -1;
          do {
            local_34 = (int)lVar7 + 2;
            pdVar6 = Ring<double>::operator[](this_00,&local_34);
            this->condSamples[lVar7 + 1] = *pdVar6;
            lVar7 = lVar7 + 1;
          } while (lVar7 < (long)this->nPost + (long)this->nPre);
        }
        if ((((this->super_Estimator).nEstimate & 4) != 0) && (-1 < this->nPost + this->nPre)) {
          lVar7 = -1;
          do {
            local_34 = (int)lVar7 + 2;
            pdVar6 = Ring<double>::operator[](this_00,&local_34);
            this->aOne[lVar7 + 1] = *pdVar6 + this->aOne[lVar7 + 1];
            lVar7 = lVar7 + 1;
          } while (lVar7 < (long)this->nPost + (long)this->nPre);
        }
        if ((((this->super_Estimator).nEstimate & 0x20) != 0) && (-1 < this->nPost + this->nPre)) {
          lVar7 = -1;
          do {
            local_34 = (int)lVar7 + 2;
            pbVar5 = Ring<bool>::operator[](this_01,&local_34);
            this->aEvents[lVar7 + 1] = (double)(int)*pbVar5 + this->aEvents[lVar7 + 1];
            lVar7 = lVar7 + 1;
          } while (lVar7 < (long)this->nPost + (long)this->nPre);
        }
        if ((((this->super_Estimator).nEstimate & 8) != 0) && (-1 < this->nPost + this->nPre)) {
          lVar7 = -1;
          do {
            local_34 = (int)lVar7 + 2;
            pdVar6 = Ring<double>::operator[](this_00,&local_34);
            this->aTwo[lVar7 + 1] = *pdVar6 * *pdVar6 + this->aTwo[lVar7 + 1];
            lVar7 = lVar7 + 1;
          } while (lVar7 < (long)this->nPost + (long)this->nPre);
        }
        if ((((this->super_Estimator).nEstimate & 0x10) != 0) && (-1 < this->nPost + this->nPre)) {
          lVar7 = -1;
          do {
            local_34 = (int)lVar7 + 2;
            pdVar6 = Ring<double>::operator[](this_00,&local_34);
            dVar8 = *pdVar6;
            this->aThree[lVar7 + 1] = dVar8 * dVar8 * dVar8 + this->aThree[lVar7 + 1];
            lVar7 = lVar7 + 1;
          } while (lVar7 < (long)this->nPost + (long)this->nPre);
        }
        if ((((this->super_Estimator).nEstimate & 2) != 0) && (-1 < this->nPost + this->nPre)) {
          lVar7 = -1;
          do {
            local_34 = (int)lVar7 + 2;
            pdVar6 = Ring<double>::operator[](this_00,&local_34);
            dVar8 = floor((*pdVar6 - this->dDistOffset) / this->dDistScale + 0.5);
            uVar4 = (uint)dVar8;
            if (-1 < (int)uVar4 && (int)uVar4 < this->nDist) {
              this->aDist[lVar7 + 1][uVar4] = this->aDist[lVar7 + 1][uVar4] + 1.0;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < (long)this->nPost + (long)this->nPre);
        }
      }
    }
  }
  return;
}

Assistant:

void ConditionalEstimator::collect()
{
	// eat next data point, without stepping stoch. variable
	double rnd = nEstimate & EST_DIFF ? pSource->getIncrement() : pSource->getCurrentValue();
	condSampleRing.next( rnd);
	
	// get next event, and write it into event cycle	
	if (condTrigger) {
		condEventRing.next( condTrigger->hasEvent() );
		
		// if an event has occured nPost steps ago, record all properties
		if (condSampleRing.isInitialized()) {
			if( condEventRing[nPre+1+nUpdateCorrection] && !hasAdditionalEvents() ) { // nPre+1 is equivalent to -nPost in a ring
				++nSamples;
				if( nEstimate & EST_SAMPLE )
					for(int i=0; i<nPre+nPost+1; i++)
						condSamples[i] = condSampleRing[i+1];
				if( nEstimate & EST_MEAN )
					for(int i=0; i<nPre+nPost+1; i++)
						aOne[i] += condSampleRing[i+1];
				if( nEstimate & EST_EVENTS )
					for(int i=0; i<nPre+nPost+1; i++)
						aEvents[i] += condEventRing[i+1];
				if( nEstimate & EST_VAR )
					for(int i=0; i<nPre+nPost+1; i++) {
						double d = condSampleRing[i+1];
						aTwo[i] += d*d;
					}
				if( nEstimate & EST_CUR )
					for(int i=0; i<nPre+nPost+1; i++) {
						double d = condSampleRing[i+1];
						aThree[i] += d*d*d;
					}
				if( nEstimate & EST_DENS )
					for(int i=0; i<nPre+nPost+1; i++) {
						int bin = (int) floor( (condSampleRing[i+1] - dDistOffset) / dDistScale + 0.5); // round
						if( (bin < nDist) && (bin >= 0) )
							aDist[ i ][ bin ]++;
					}
			}
		}
	} 
	else {
		condConditionRing.next( rnd /*condCondition->getIncrement()*/ );
			   
		// record all properties mulitplied with the condition at the time of recording
		if (condSampleRing.isInitialized()) {
			double cnd = condConditionRing[nPre+1-2]; // nPre+1 is equivalent to -nPost in a ring, the '2' accounts for update delays			
			++nSamples;
			if( nEstimate & EST_SAMPLE )
				for(int i=0; i<nPre+nPost+1; i++)
					condSamples[i] = condSampleRing[i+1] * cnd;
			if( nEstimate & EST_MEAN )
				for(int i=0; i<nPre+nPost+1; i++)
					aOne[i] += condSampleRing[i+1] * cnd;
			if( nEstimate & EST_VAR )
				for(int i=0; i<nPre+nPost+1; i++) {
					double d = condSampleRing[i+1];
					aTwo[i] += d*d*cnd;
				}
			if( nEstimate & EST_CUR )
				for(int i=0; i<nPre+nPost+1; i++) {
					double d = condSampleRing[i+1];
					aThree[i] += d*d*d*cnd;
				}
			if( nEstimate & EST_DENS )
				for(int i=0; i<nPre+nPost+1; i++) {
					int bin = (int) floor( (condSampleRing[i]*cnd - dDistOffset) / dDistScale + 0.5 ); // round
					if( (bin <= nDist) && (bin >= 0) )
						aDist[ i ][ bin ]++;
				}
		}
	}
}